

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_TEXBEM(Context *ctx)

{
  char local_308 [8];
  char code [512];
  char sampler [64];
  char src [64];
  char dst [64];
  DestArgInfo *info;
  Context *ctx_local;
  
  get_METAL_destarg_varname(ctx,src + 0x38,0x40);
  get_METAL_srcarg_varname(ctx,0,sampler + 0x38,0x40);
  ctx->metal_need_header_texture = 1;
  get_METAL_varname_in_buf(ctx,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum,code + 0x1f8,0x40);
  make_METAL_destarg_assign
            (ctx,local_308,0x200,
             "%s_texture.sample(%s, float2(%s.x + (%s_texbem.x * %s.x) + (%s_texbem.z * %s.y), %s.y + (%s_texbem.y * %s.x) + (%s_texbem.w * %s.y)))"
             ,code + 0x1f8,code + 0x1f8,src + 0x38,code + 0x1f8,sampler + 0x38,code + 0x1f8,
             sampler + 0x38,src + 0x38,code + 0x1f8,sampler + 0x38,code + 0x1f8,sampler + 0x38);
  output_line(ctx,"%s",local_308);
  return;
}

Assistant:

static void emit_METAL_TEXBEM(Context *ctx)
{
    DestArgInfo *info = &ctx->dest_arg;
    char dst[64]; get_METAL_destarg_varname(ctx, dst, sizeof (dst));
    char src[64]; get_METAL_srcarg_varname(ctx, 0, src, sizeof (src));
    char sampler[64];
    char code[512];

    ctx->metal_need_header_texture = 1;

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));

    make_METAL_destarg_assign(ctx, code, sizeof (code),
        "%s_texture.sample(%s, float2(%s.x + (%s_texbem.x * %s.x) + (%s_texbem.z * %s.y),"
        " %s.y + (%s_texbem.y * %s.x) + (%s_texbem.w * %s.y)))",
        sampler, sampler,
        dst, sampler, src, sampler, src,
        dst, sampler, src, sampler, src);

    output_line(ctx, "%s", code);
}